

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

void rmoldest(logdir *ld)

{
  uint uVar1;
  int iVar2;
  DIR *__dirp;
  int *piVar3;
  dirent *pdVar4;
  int local_4c;
  char local_48 [4];
  int n;
  char oldest [30];
  dirent *f;
  DIR *d;
  logdir *ld_local;
  
  local_4c = 0;
  local_48[0] = 'A';
  oldest[0x13] = '\0';
  local_48[1] = 0;
  while (__dirp = opendir("."), __dirp == (DIR *)0x0) {
    pause2("unable to open directory, want rotate",ld->name);
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  while (pdVar4 = readdir(__dirp), pdVar4 != (dirent *)0x0) {
    if ((pdVar4->d_name[0] == '@') && (uVar1 = str_len(pdVar4->d_name), uVar1 == 0x1b)) {
      if (pdVar4->d_name[0x1a] == 't') {
        iVar2 = unlink(pdVar4->d_name);
        if (iVar2 == -1) {
          warn2("unable to unlink processor leftover",pdVar4->d_name);
        }
      }
      else {
        local_4c = local_4c + 1;
        iVar2 = str_diff(pdVar4->d_name,local_48);
        if (iVar2 < 0) {
          byte_copy(local_48,0x1b,pdVar4->d_name);
        }
      }
      piVar3 = __errno_location();
      *piVar3 = 0;
    }
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    warn2("unable to read directory",ld->name);
  }
  closedir(__dirp);
  if ((ld->nmax != 0) && (ld->nmax < (ulong)(long)local_4c)) {
    if (verbose != 0) {
      strerr_warn("svlogd: info: ","delete: ",ld->name,"/",local_48,(char *)0x0,(strerr *)0x0);
    }
    if ((local_48[0] == '@') && (iVar2 = unlink(local_48), iVar2 == -1)) {
      warn2("unable to unlink oldest logfile",ld->name);
    }
  }
  return;
}

Assistant:

void rmoldest(struct logdir *ld) {
  DIR *d;
  direntry *f;
  char oldest[FMT_PTIME];
  int n =0;

  oldest[0] ='A'; oldest[1] =oldest[27] =0;
  while (! (d =opendir(".")))
    pause2("unable to open directory, want rotate", ld->name);
  errno =0;
  while ((f =readdir(d)))
    if ((f->d_name[0] == '@') && (str_len(f->d_name) == 27)) {
      if (f->d_name[26] == 't') {
        if (unlink(f->d_name) == -1)
          warn2("unable to unlink processor leftover", f->d_name);
      }
      else {
        ++n;
        if (str_diff(f->d_name, oldest) < 0) byte_copy(oldest, 27, f->d_name);
      }
      errno =0;
    }
  if (errno) warn2("unable to read directory", ld->name);
  closedir(d);

  if (ld->nmax && (n > ld->nmax)) {
    if (verbose) strerr_warn5(INFO, "delete: ", ld->name, "/", oldest, 0);
    if ((*oldest == '@') && (unlink(oldest) == -1))
      warn2("unable to unlink oldest logfile", ld->name);
  }
}